

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

StackFrame * __thiscall
moira::Moira::makeFrame<0ull>(StackFrame *__return_storage_ptr__,Moira *this,u32 addr)

{
  u16 sr;
  u16 ird;
  u32 pc;
  u32 addr_local;
  Moira *this_local;
  
  pc = getPC(this);
  sr = getSR(this);
  ird = getIRD(this);
  makeFrame<0ull>(__return_storage_ptr__,this,addr,pc,sr,ird);
  return __return_storage_ptr__;
}

Assistant:

StackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame<F>(addr, getPC(), getSR(), getIRD());
}